

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

bool __thiscall libcellml::ComponentEntity::doEquals(ComponentEntity *this,EntityPtr *other)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  size_type sVar5;
  size_t sVar6;
  ComponentEntityImpl *pCVar7;
  reference component_00;
  element_type *peVar8;
  shared_ptr<libcellml::Component> *component;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  *__range3;
  string local_60;
  undefined1 local_30 [8];
  shared_ptr<libcellml::ComponentEntity> componentEntity;
  EntityPtr *other_local;
  ComponentEntity *this_local;
  
  componentEntity.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  bVar2 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (bVar2) {
    std::dynamic_pointer_cast<libcellml::ComponentEntity,libcellml::Entity>
              ((shared_ptr<libcellml::Entity> *)local_30);
    bVar3 = std::operator!=((shared_ptr<libcellml::ComponentEntity> *)local_30,(nullptr_t)0x0);
    bVar1 = false;
    bVar2 = false;
    if (bVar3) {
      pCVar7 = pFunc(this);
      peVar8 = std::
               __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      encapsulationId_abi_cxx11_(&local_60,peVar8);
      bVar1 = true;
      _Var4 = std::operator==(&pCVar7->mEncapsulationId,&local_60);
      bVar2 = false;
      if (_Var4) {
        pCVar7 = pFunc(this);
        sVar5 = std::
                vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ::size(&pCVar7->mComponents);
        peVar8 = std::
                 __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        sVar6 = componentCount(peVar8);
        bVar2 = sVar5 == sVar6;
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (bVar2) {
      pCVar7 = pFunc(this);
      __end3 = std::
               vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               ::begin(&pCVar7->mComponents);
      component = (shared_ptr<libcellml::Component> *)
                  std::
                  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                  ::end(&pCVar7->mComponents);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                                         *)&component), bVar2) {
        component_00 = __gnu_cxx::
                       __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                       ::operator*(&__end3);
        peVar8 = std::
                 __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        bVar2 = containsComponent(peVar8,component_00,false);
        if (!bVar2) {
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_002b3c74;
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
        ::operator++(&__end3);
      }
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
LAB_002b3c74:
    std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr
              ((shared_ptr<libcellml::ComponentEntity> *)local_30);
    if (bVar2) goto LAB_002b3c9c;
  }
  this_local._7_1_ = 0;
LAB_002b3c9c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ComponentEntity::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto componentEntity = std::dynamic_pointer_cast<ComponentEntity>(other);
        if ((componentEntity != nullptr)
            && pFunc()->mEncapsulationId == componentEntity->encapsulationId()
            && pFunc()->mComponents.size() == componentEntity->componentCount()) {
            for (const auto &component : pFunc()->mComponents) {
                if (!componentEntity->containsComponent(component, false)) {
                    return false;
                }
            }
            return true;
        }
    }

    return false;
}